

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O1

void Parse(lemon *gp)

{
  char *pcVar1;
  ushort *puVar2;
  char **ppcVar3;
  int iVar4;
  int iVar5;
  FILE *__stream;
  ulong uVar6;
  char *__ptr;
  size_t sVar7;
  long lVar8;
  long lVar9;
  ushort **ppuVar10;
  char *pcVar11;
  rule *prVar12;
  symbol *psVar13;
  undefined8 *puVar14;
  undefined8 *puVar15;
  void *pvVar16;
  byte bVar17;
  char cVar18;
  ulong uVar19;
  undefined8 *puVar20;
  char cVar21;
  byte bVar22;
  char *pcVar23;
  int iVar24;
  uint uVar25;
  char *pcVar26;
  char *pcVar27;
  char *pcVar28;
  byte bVar29;
  size_t sVar30;
  uint uVar31;
  int iVar32;
  ulong uVar33;
  long lVar34;
  ulong uVar35;
  bool bVar36;
  bool bVar37;
  char *endptr;
  int local_3fbc;
  char *local_3f78 [8];
  char *local_3f38;
  uint local_3f30;
  int local_3f2c;
  char *local_3f28;
  lemon *local_3f20;
  undefined4 local_3f18;
  symbol *local_3f10;
  symbol *local_3f08;
  char *local_3f00;
  uint local_3ef8;
  undefined8 auStack_3ef0 [999];
  undefined8 auStack_1fb8 [1001];
  rule *local_70;
  char *local_68;
  char **local_60;
  int local_58;
  int *local_50;
  e_assoc local_48;
  int local_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined4 uStack_38;
  undefined4 uStack_34;
  
  memset(&local_3f38,0,0x3f08);
  local_3f38 = gp->filename;
  local_3f2c = 0;
  local_3f18 = 0;
  local_3f20 = gp;
  __stream = fopen(local_3f38,"rb");
  if (__stream == (FILE *)0x0) {
    Parse_cold_9();
  }
  else {
    fseek(__stream,0,2);
    uVar6 = ftell(__stream);
    rewind(__stream);
    uVar25 = (int)uVar6 + 1;
    __ptr = (char *)malloc((long)(int)uVar25);
    if (__ptr == (char *)0x0) {
      ErrorMsg(local_3f38,0,"Can\'t allocate %d of memory to hold this file.",(ulong)uVar25);
    }
    else {
      sVar30 = (size_t)(int)uVar6;
      sVar7 = fread(__ptr,1,sVar30,__stream);
      if (sVar7 == sVar30) {
        fclose(__stream);
        __ptr[sVar30] = '\0';
        ppcVar3 = azDefine;
        iVar5 = nDefine;
        lVar8 = (long)nDefine;
        uVar6 = (ulong)(uint)nDefine;
        pcVar27 = __ptr + 6;
        uVar25 = 0;
        local_3fbc = 0;
        uVar33 = 6;
        pcVar28 = __ptr;
        for (lVar34 = 0; (cVar21 = __ptr[lVar34], cVar21 == '\n' || (cVar21 != '\0'));
            lVar34 = lVar34 + 1) {
          if ((cVar21 == '%') && ((pcVar11 = __ptr + lVar34, lVar34 == 0 || (pcVar11[-1] == '\n'))))
          {
            iVar4 = strncmp(pcVar11,"%endif",6);
            if ((iVar4 == 0) &&
               (ppuVar10 = __ctype_b_loc(),
               (*(byte *)((long)*ppuVar10 + (long)pcVar11[6] * 2 + 1) & 0x20) != 0)) {
              pcVar11 = pcVar28;
              if (uVar25 == 0) {
LAB_00106361:
                uVar25 = 0;
              }
              else {
                uVar25 = uVar25 - 1;
                if (uVar25 == 0) {
                  lVar9 = (long)local_3fbc;
                  if (lVar9 < lVar34) {
                    do {
                      if (__ptr[lVar9] != '\n') {
                        __ptr[lVar9] = ' ';
                      }
                      lVar9 = lVar9 + 1;
                    } while (lVar34 != lVar9);
                  }
                  goto LAB_00106361;
                }
              }
              for (; (*pcVar11 != '\0' && (*pcVar11 != '\n')); pcVar11 = pcVar11 + 1) {
                *pcVar11 = ' ';
              }
            }
            else {
              iVar4 = strncmp(pcVar11,"%ifdef",6);
              if (((iVar4 == 0) &&
                  (ppuVar10 = __ctype_b_loc(),
                  (*(byte *)((long)*ppuVar10 + (long)pcVar11[6] * 2 + 1) & 0x20) != 0)) ||
                 ((iVar4 = strncmp(pcVar11,"%ifndef",7), iVar4 == 0 &&
                  (ppuVar10 = __ctype_b_loc(),
                  (*(byte *)((long)*ppuVar10 + (long)pcVar11[7] * 2 + 1) & 0x20) != 0)))) {
                pcVar23 = pcVar28;
                if (uVar25 == 0) {
                  ppuVar10 = __ctype_b_loc();
                  uVar19 = uVar33;
                  pcVar26 = pcVar27;
                  do {
                    pcVar1 = pcVar26 + 1;
                    pcVar26 = pcVar26 + 1;
                    uVar19 = uVar19 + 1;
                  } while ((*(byte *)((long)*ppuVar10 + (long)*pcVar1 * 2 + 1) & 0x20) != 0);
                  cVar21 = __ptr[uVar19 & 0xffffffff];
                  if (cVar21 == '\0') {
                    uVar35 = 0;
                  }
                  else {
                    uVar35 = 0;
                    do {
                      if ((*(byte *)((long)*ppuVar10 + (long)cVar21 * 2 + 1) & 0x20) != 0) break;
                      cVar21 = __ptr[uVar35 + (uVar19 & 0xffffffff) + 1];
                      uVar35 = uVar35 + 1;
                    } while (cVar21 != '\0');
                  }
                  bVar36 = true;
                  bVar37 = 0 < lVar8;
                  if (0 < iVar5) {
                    bVar37 = true;
                    uVar19 = 1;
                    do {
                      pcVar1 = ppcVar3[uVar19 - 1];
                      iVar4 = strncmp(pcVar1,pcVar26,uVar35 & 0xffffffff);
                      if ((iVar4 == 0) && (sVar7 = strlen(pcVar1), (int)uVar35 == (int)sVar7)) {
                        bVar36 = false;
                        goto LAB_00106463;
                      }
                      bVar37 = (long)uVar19 < lVar8;
                      bVar36 = uVar19 != uVar6;
                      uVar19 = uVar19 + 1;
                    } while (bVar36);
                    bVar36 = true;
                  }
LAB_00106463:
                  if (pcVar11[3] != 'n') {
                    bVar37 = bVar36;
                  }
                  if (bVar37) {
                    local_3fbc = (int)lVar34;
                  }
                  uVar25 = (uint)bVar37;
                }
                else {
                  uVar25 = uVar25 + 1;
                }
                for (; (*pcVar23 != '\0' && (*pcVar23 != '\n')); pcVar23 = pcVar23 + 1) {
                  *pcVar23 = ' ';
                }
              }
            }
          }
          pcVar28 = pcVar28 + 1;
          pcVar27 = pcVar27 + 1;
          uVar33 = uVar33 + 1;
        }
        if (uVar25 != 0) {
          Parse_cold_1();
          if (x2a == (s_x2 *)0x0) {
            return;
          }
          return;
        }
        uVar25 = 1;
        pcVar27 = __ptr;
LAB_001064db:
        while( true ) {
          while( true ) {
            cVar21 = *pcVar27;
            lVar8 = (long)cVar21;
            if (lVar8 == 10) {
              uVar25 = uVar25 + 1;
            }
            else if (cVar21 == '\0') {
              free(__ptr);
              gp->rule = (rule *)CONCAT44(uStack_3c,uStack_40);
              gp->errorcnt = local_3f2c;
              return;
            }
            ppuVar10 = __ctype_b_loc();
            if ((*(byte *)((long)*ppuVar10 + lVar8 * 2 + 1) & 0x20) == 0) break;
            pcVar27 = pcVar27 + 1;
          }
          if (cVar21 != '/') break;
          if (pcVar27[1] == '*') {
            cVar21 = pcVar27[2];
            bVar37 = cVar21 != '\0';
            if (cVar21 == '\0') {
              pcVar27 = pcVar27 + 2;
            }
            else {
              pcVar27 = pcVar27 + 3;
              do {
                if (cVar21 == '\n') {
                  uVar25 = uVar25 + 1;
                }
                else if ((cVar21 == '/') && (pcVar27[-2] == '*')) break;
                cVar21 = *pcVar27;
                pcVar27 = pcVar27 + 1;
                bVar37 = cVar21 != '\0';
              } while (bVar37);
              pcVar27 = pcVar27 + -1;
            }
            pcVar27 = pcVar27 + bVar37;
          }
          else {
            if (pcVar27[1] != '/') break;
            for (pcVar27 = pcVar27 + 2; (*pcVar27 != '\0' && (*pcVar27 != '\n'));
                pcVar27 = pcVar27 + 1) {
            }
          }
        }
        uVar31 = uVar25;
        local_3f30 = uVar25;
        local_3f28 = pcVar27;
        if (cVar21 == '{') {
          pcVar28 = pcVar27 + 1;
          bVar17 = pcVar27[1];
          if (bVar17 != 0) {
            iVar5 = 1;
            do {
              if ((iVar5 < 2) && (bVar17 == 0x7d)) {
                pcVar27 = pcVar27 + 2;
                goto LAB_001067a7;
              }
              if (bVar17 < 0x2f) {
                if (bVar17 == 10) {
LAB_00106682:
                  uVar31 = uVar31 + 1;
                }
                else if ((bVar17 == 0x22) || (bVar17 == 0x27)) {
                  bVar22 = pcVar28[1];
                  pcVar28 = pcVar28 + 1;
                  if (bVar22 != 0) {
                    bVar29 = 0;
                    do {
                      if ((bVar29 != 0x5c) && (bVar22 == bVar17)) break;
                      uVar31 = uVar31 + (bVar22 == 10);
                      bVar37 = bVar29 == 0x5c;
                      bVar29 = bVar22;
                      if (bVar37) {
                        bVar29 = 0;
                      }
                      bVar22 = pcVar28[1];
                      pcVar28 = pcVar28 + 1;
                    } while (bVar22 != 0);
                  }
                }
              }
              else if (bVar17 == 0x2f) {
                if (pcVar27[2] == '/') {
                  for (pcVar28 = pcVar27 + 3; *pcVar28 != '\0'; pcVar28 = pcVar28 + 1) {
                    if (*pcVar28 == '\n') goto LAB_00106682;
                  }
                }
                else if (pcVar27[2] == '*') {
                  pcVar28 = pcVar27 + 3;
                  if (pcVar27[3] != '\0') {
                    cVar21 = '\0';
                    cVar18 = pcVar27[3];
                    do {
                      if (cVar21 == '*' && cVar18 == '/') break;
                      uVar31 = uVar31 + (cVar18 == '\n');
                      pcVar27 = pcVar28 + 1;
                      pcVar28 = pcVar28 + 1;
                      cVar21 = cVar18;
                      cVar18 = *pcVar27;
                    } while (*pcVar27 != '\0');
                  }
                }
              }
              else if (bVar17 == 0x7b) {
                iVar5 = iVar5 + 1;
              }
              else if (bVar17 == 0x7d) {
                iVar5 = iVar5 + -1;
              }
              pcVar27 = pcVar28;
              pcVar28 = pcVar27 + 1;
              bVar17 = pcVar27[1];
            } while (bVar17 != 0);
          }
          ErrorMsg(local_3f38,uVar25,
                   "C code starting on this line is not terminated before the end of the file.");
          local_3f2c = local_3f2c + 1;
          pcVar27 = pcVar28;
        }
        else {
          pcVar28 = pcVar27;
          if (cVar21 == '\"') {
            do {
              pcVar27 = pcVar28 + 1;
              while( true ) {
                pcVar28 = pcVar27;
                cVar21 = *pcVar28;
                if (cVar21 == '\n') break;
                pcVar27 = pcVar28 + 1;
                if (cVar21 == '\"') goto LAB_001067a7;
                if (cVar21 == '\0') {
                  Parse_cold_2();
                  pcVar27 = pcVar28;
                  goto LAB_001067a7;
                }
              }
              uVar31 = uVar31 + 1;
            } while( true );
          }
          puVar2 = *ppuVar10;
          if ((puVar2[lVar8] & 8) == 0) {
            if ((cVar21 == '/') || (cVar21 == '|')) {
              if ((*(byte *)((long)puVar2 + (long)pcVar27[1] * 2 + 1) & 4) == 0) goto LAB_001067a1;
              cVar21 = pcVar27[2];
              pcVar28 = pcVar27 + 2;
              while ((pcVar27 = pcVar28, cVar21 != '\0' &&
                     ((cVar21 == '_' || ((puVar2[cVar21] & 8) != 0))))) {
                cVar21 = pcVar28[1];
                pcVar28 = pcVar28 + 1;
              }
            }
            else if (((cVar21 == ':') && (pcVar27[1] == ':')) && (pcVar27[2] == '=')) {
              pcVar28 = pcVar27 + 3;
              pcVar27 = pcVar28;
            }
            else {
LAB_001067a1:
              pcVar28 = pcVar27 + 1;
              pcVar27 = pcVar28;
            }
          }
          else {
            cVar21 = *pcVar27;
            while ((pcVar27 = pcVar28, cVar21 != '\0' &&
                   ((cVar21 == '_' || ((puVar2[cVar21] & 8) != 0))))) {
              cVar21 = pcVar28[1];
              pcVar28 = pcVar28 + 1;
            }
          }
        }
LAB_001067a7:
        uVar25 = uVar31;
        cVar21 = *pcVar28;
        *pcVar28 = '\0';
        pcVar11 = Strsafe(local_3f28);
        uVar31 = local_3ef8;
        psVar13 = local_3f10;
        switch(local_3f18) {
        case 0:
          local_70 = (rule *)0x0;
          uStack_34 = 0;
          local_44 = 0;
          uStack_40 = 0;
          uStack_3c = 0;
          uStack_38 = 0;
          local_3f20->nrule = 0;
        case 1:
          cVar18 = *pcVar11;
          if ((long)cVar18 == 0x25) {
LAB_00106cd1:
            local_3f18 = 2;
          }
          else if ((*(byte *)((long)*ppuVar10 + (long)cVar18 * 2 + 1) & 2) == 0) {
            if (cVar18 == '[') {
              local_3f18 = 0xc;
            }
            else if (cVar18 == '{') {
              if (local_70 == (rule *)0x0) {
                Parse_cold_8();
                psVar13 = local_3f10;
              }
              else if (local_70->code == (char *)0x0) {
                local_70->line = local_3f30;
                local_70->code = pcVar11 + 1;
              }
              else {
                Parse_cold_7();
                psVar13 = local_3f10;
              }
            }
            else {
              pcVar23 = "Token \"%s\" should be either \"%%\" or a nonterminal name.";
LAB_00107803:
              ErrorMsg(local_3f38,local_3f30,pcVar23,pcVar11);
              local_3f2c = local_3f2c + 1;
              psVar13 = local_3f10;
            }
          }
          else {
            local_3f08 = Symbol_new(pcVar11);
            local_3ef8 = 0;
            local_3f00 = (char *)0x0;
            local_3f18 = 5;
            psVar13 = local_3f10;
          }
          break;
        case 2:
          if ((*(byte *)((long)*ppuVar10 + (long)*pcVar11 * 2 + 1) & 4) == 0) {
            pcVar23 = "Illegal declaration keyword: \"%s\".";
LAB_0010755f:
            ErrorMsg(local_3f38,local_3f30,pcVar23,pcVar11);
LAB_001075a8:
            local_3f2c = local_3f2c + 1;
            local_3f18 = 0xf;
            psVar13 = local_3f10;
          }
          else {
            local_60 = (char **)0x0;
            local_50 = (int *)0x0;
            local_58 = 1;
            local_3f18 = 3;
            local_68 = pcVar11;
            iVar5 = strcmp(pcVar11,"name");
            if (iVar5 == 0) {
              local_60 = &local_3f20->name;
              goto LAB_00107239;
            }
            iVar5 = strcmp(pcVar11,"include");
            if (iVar5 == 0) {
              local_60 = &local_3f20->include;
              psVar13 = local_3f10;
              break;
            }
            iVar5 = strcmp(pcVar11,"code");
            if (iVar5 == 0) {
              lVar8 = 0x98;
            }
            else {
              iVar5 = strcmp(pcVar11,"token_destructor");
              if (iVar5 == 0) {
                lVar8 = 0xa0;
              }
              else {
                iVar5 = strcmp(pcVar11,"default_destructor");
                if (iVar5 != 0) {
                  iVar5 = strcmp(pcVar11,"token_prefix");
                  if (iVar5 == 0) {
                    local_60 = &local_3f20->tokenprefix;
LAB_00107239:
                    local_58 = 0;
                    psVar13 = local_3f10;
                  }
                  else {
                    iVar5 = strcmp(pcVar11,"syntax_error");
                    if (iVar5 != 0) {
                      iVar5 = strcmp(pcVar11,"parse_accept");
                      if (iVar5 == 0) {
                        lVar8 = 0x90;
                      }
                      else {
                        iVar5 = strcmp(pcVar11,"parse_failure");
                        if (iVar5 != 0) {
                          iVar5 = strcmp(pcVar11,"stack_overflow");
                          if (iVar5 != 0) {
                            iVar5 = strcmp(pcVar11,"extra_argument");
                            if (iVar5 == 0) {
                              local_60 = &local_3f20->arg;
                            }
                            else {
                              iVar5 = strcmp(pcVar11,"token_type");
                              if (iVar5 == 0) {
                                local_60 = &local_3f20->tokentype;
                              }
                              else {
                                iVar5 = strcmp(pcVar11,"default_type");
                                if (iVar5 == 0) {
                                  local_60 = &local_3f20->vartype;
                                }
                                else {
                                  iVar5 = strcmp(pcVar11,"stack_size");
                                  if (iVar5 == 0) {
                                    local_60 = &local_3f20->stacksize;
                                  }
                                  else {
                                    iVar5 = strcmp(pcVar11,"start_symbol");
                                    if (iVar5 != 0) {
                                      iVar5 = strcmp(pcVar11,"left");
                                      if (iVar5 == 0) {
                                        local_44 = local_44 + 1;
                                        local_48 = LEFT;
                                      }
                                      else {
                                        iVar5 = strcmp(pcVar11,"right");
                                        if (iVar5 == 0) {
                                          local_44 = local_44 + 1;
                                          local_48 = RIGHT;
                                        }
                                        else {
                                          iVar5 = strcmp(pcVar11,"nonassoc");
                                          if (iVar5 != 0) {
                                            iVar5 = strcmp(pcVar11,"destructor");
                                            if (iVar5 == 0) {
                                              local_3f18 = 0x10;
                                              psVar13 = local_3f10;
                                            }
                                            else {
                                              iVar5 = strcmp(pcVar11,"type");
                                              if (iVar5 == 0) {
                                                local_3f18 = 0x11;
                                                psVar13 = local_3f10;
                                              }
                                              else {
                                                iVar5 = strcmp(pcVar11,"fallback");
                                                if (iVar5 == 0) {
                                                  local_3f10 = (symbol *)0x0;
                                                  local_3f18 = 0x12;
                                                  psVar13 = local_3f10;
                                                }
                                                else {
                                                  iVar5 = strcmp(pcVar11,"wildcard");
                                                  if (iVar5 == 0) {
                                                    local_3f18 = 0x14;
                                                    psVar13 = local_3f10;
                                                  }
                                                  else {
                                                    iVar5 = strcmp(pcVar11,"expect");
                                                    if (iVar5 != 0) {
                                                      pcVar23 = 
                                                  "Unknown declaration keyword: \"%%%s\".";
                                                  goto LAB_0010755f;
                                                  }
                                                  if (-1 < local_3f20->nexpected) {
                                                    pcVar11 = "Multiple %expect declarations.";
                                                    goto LAB_001075a1;
                                                  }
                                                  local_3f18 = 0x13;
                                                  psVar13 = local_3f10;
                                                  }
                                                }
                                              }
                                            }
                                            break;
                                          }
                                          local_44 = local_44 + 1;
                                          local_48 = NONE;
                                        }
                                      }
                                      local_3f18 = 4;
                                      psVar13 = local_3f10;
                                      break;
                                    }
                                    local_60 = &local_3f20->start;
                                  }
                                }
                              }
                            }
                            goto LAB_00107239;
                          }
                          local_60 = &local_3f20->overflow;
                          psVar13 = local_3f10;
                          break;
                        }
                        lVar8 = 0x88;
                      }
                      goto LAB_00107671;
                    }
                    local_60 = &local_3f20->error;
                    psVar13 = local_3f10;
                  }
                  break;
                }
                lVar8 = 0xa8;
              }
            }
LAB_00107671:
            local_60 = (char **)((long)&local_3f20->sorted + lVar8);
            psVar13 = local_3f10;
          }
          break;
        case 3:
          cVar18 = *pcVar11;
          if (((cVar18 != '\"') && (cVar18 != '{')) && (((*ppuVar10)[cVar18] & 8) == 0)) {
            ErrorMsg(local_3f38,local_3f30,"Illegal argument to %%%s: %s",local_68,pcVar11);
            goto LAB_001075a8;
          }
          if ((cVar18 == '{') || (cVar18 == '\"')) {
            pcVar11 = pcVar11 + 1;
          }
          sVar7 = strlen(pcVar11);
          pcVar23 = *local_60;
          if (pcVar23 == (char *)0x0) {
            pcVar23 = "";
          }
          sVar30 = strlen(pcVar23);
          bVar37 = false;
          if ((local_3f20->nolinenosflag == 0) && (local_58 != 0)) {
            if (local_50 == (int *)0x0) {
              bVar37 = true;
            }
            else {
              bVar37 = *local_50 != 0;
            }
          }
          iVar5 = (int)sVar7;
          iVar4 = (int)sVar30;
          iVar24 = iVar5 + iVar4 + 0x14;
          if (bVar37) {
            iVar32 = 0;
            pcVar23 = local_3f38;
            do {
              if (*pcVar23 == '\\') {
                iVar32 = iVar32 + 1;
              }
              else if (*pcVar23 == '\0') goto LAB_00107330;
              pcVar23 = pcVar23 + 1;
            } while( true );
          }
          sVar7 = 0;
          goto LAB_00107374;
        case 4:
          if ((long)*pcVar11 == 0x2e) goto LAB_0010704a;
          if ((*(byte *)((long)*ppuVar10 + (long)*pcVar11 * 2 + 1) & 1) == 0) {
            pcVar23 = "Can\'t assign a precedence to \"%s\".";
          }
          else {
            psVar13 = Symbol_new(pcVar11);
            if (psVar13->prec < 0) {
              psVar13->prec = local_44;
              psVar13->assoc = local_48;
              psVar13 = local_3f10;
              break;
            }
            pcVar23 = "Symbol \"%s\" has already be given a precedence.";
          }
          goto LAB_00107803;
        case 5:
          if (*pcVar11 == '(') {
            local_3f18 = 7;
          }
          else {
            if (((*pcVar11 == ':') && (pcVar11[1] == ':')) && (pcVar11[2] == '='))
            goto LAB_00106943;
            pcVar11 = local_3f08->name;
            pcVar23 = "Expected to see a \":\" following the LHS symbol \"%s\".";
LAB_00107866:
            ErrorMsg(local_3f38,local_3f30,pcVar23,pcVar11);
LAB_0010786d:
            local_3f2c = local_3f2c + 1;
            local_3f18 = 0xe;
            psVar13 = local_3f10;
          }
          break;
        case 6:
          cVar18 = *pcVar11;
          if ((long)cVar18 == 0x2e) {
            uVar6 = (ulong)local_3ef8;
            lVar8 = (long)(int)local_3ef8;
            prVar12 = (rule *)calloc(lVar8 * 0x10 + 0x60,1);
            if (prVar12 == (rule *)0x0) {
              ErrorMsg(local_3f38,local_3f30,"Can\'t allocate enough memory for this rule.");
              local_3f2c = local_3f2c + 1;
              local_70 = (rule *)0x0;
            }
            else {
              prVar12->ruleline = local_3f30;
              prVar12->rhs = &prVar12[1].lhs;
              prVar12->rhsalias = (char **)(&prVar12[1].lhs + lVar8);
              if (0 < (int)uVar31) {
                uVar33 = 0;
                do {
                  prVar12->rhs[uVar33] = (symbol *)auStack_3ef0[uVar33];
                  prVar12->rhsalias[uVar33] = (char *)auStack_1fb8[uVar33 + 1];
                  uVar33 = uVar33 + 1;
                } while (uVar6 != uVar33);
              }
              prVar12->lhs = local_3f08;
              prVar12->lhsalias = local_3f00;
              prVar12->nrhs = uVar31;
              prVar12->code = (char *)0x0;
              prVar12->precsym = (symbol *)0x0;
              iVar5 = local_3f20->nrule;
              local_3f20->nrule = iVar5 + 1;
              prVar12->index = iVar5;
              prVar12->nextlhs = local_3f08->rule;
              local_3f08->rule = prVar12;
              prVar12->next = (rule *)0x0;
              bVar37 = CONCAT44(uStack_3c,uStack_40) != 0;
              puVar20 = (undefined8 *)(CONCAT44(uStack_34,uStack_38) + 0x58);
              if (!bVar37) {
                puVar20 = (undefined8 *)&uStack_38;
              }
              *puVar20 = prVar12;
              *(rule **)(&uStack_40 + (ulong)bVar37 * 2) = prVar12;
              local_70 = prVar12;
            }
            local_3f18 = 1;
            psVar13 = local_3f10;
          }
          else {
            if ((*(byte *)((long)*ppuVar10 + (long)cVar18 * 2 + 1) & 4) == 0) {
              if (cVar18 == '(') {
LAB_001074ee:
                if (0 < (int)local_3ef8) {
                  local_3f18 = 10;
                  break;
                }
              }
              else if ((cVar18 == '|') || (cVar18 == '/')) {
                lVar8 = (long)(int)local_3ef8;
                if (0 < lVar8) {
                  puVar20 = (undefined8 *)auStack_3ef0[local_3ef8 - 1];
                  puVar14 = puVar20;
                  if (*(int *)((long)puVar20 + 0xc) != 2) {
                    puVar14 = (undefined8 *)calloc(1,0x60);
                    *puVar14 = 0;
                    puVar14[1] = 0;
                    puVar14[10] = 0;
                    puVar14[0xb] = 0;
                    puVar14[2] = 0;
                    puVar14[3] = 0;
                    puVar14[4] = 0;
                    puVar14[5] = 0;
                    puVar14[6] = 0;
                    puVar14[7] = 0;
                    puVar14[8] = 0;
                    puVar14[9] = 0;
                    *(undefined4 *)((long)puVar14 + 0xc) = 2;
                    *(undefined4 *)((long)puVar14 + 0x54) = 1;
                    puVar15 = (undefined8 *)calloc(1,8);
                    puVar14[0xb] = puVar15;
                    *puVar15 = puVar20;
                    *puVar14 = *puVar20;
                    auStack_3ef0[lVar8 + -1] = puVar14;
                  }
                  iVar5 = *(int *)((long)puVar14 + 0x54);
                  *(int *)((long)puVar14 + 0x54) = iVar5 + 1;
                  pvVar16 = realloc((void *)puVar14[0xb],(long)iVar5 * 8 + 8);
                  puVar14[0xb] = pvVar16;
                  psVar13 = Symbol_new(pcVar11 + 1);
                  *(symbol **)(puVar14[0xb] + -8 + (long)*(int *)((long)puVar14 + 0x54) * 8) =
                       psVar13;
                  if (((*(byte *)((long)*ppuVar10 + (long)pcVar11[1] * 2 + 1) & 2) != 0) ||
                     (psVar13 = local_3f10,
                     (*(byte *)((long)*ppuVar10 +
                               (long)*(char *)**(undefined8 **)puVar14[0xb] * 2 + 1) & 2) != 0)) {
                    Parse_cold_3();
                    psVar13 = local_3f10;
                  }
                  break;
                }
                if (cVar18 == '(') goto LAB_001074ee;
              }
              pcVar23 = "Illegal character on RHS of rule: \"%s\".";
              goto LAB_00107866;
            }
            if (999 < (int)local_3ef8) {
              pcVar23 = "Too many symbols on RHS of rule beginning at \"%s\".";
              goto LAB_00107866;
            }
            psVar13 = Symbol_new(pcVar11);
            auStack_3ef0[(int)local_3ef8] = psVar13;
            auStack_1fb8[(long)(int)local_3ef8 + 1] = 0;
            local_3ef8 = local_3ef8 + 1;
            psVar13 = local_3f10;
          }
          break;
        case 7:
          if ((*(byte *)((long)*ppuVar10 + (long)*pcVar11 * 2 + 1) & 4) == 0) {
            pcVar23 = local_3f08->name;
            pcVar26 = "\"%s\" is not a valid alias for the LHS \"%s\"\n";
LAB_001075eb:
            ErrorMsg(local_3f38,local_3f30,pcVar26,pcVar11,pcVar23);
            goto LAB_0010786d;
          }
          local_3f18 = 8;
          local_3f00 = pcVar11;
          break;
        case 8:
          if (*pcVar11 != ')') {
LAB_001074b1:
            pcVar23 = "Missing \")\" following LHS alias name \"%s\".";
            pcVar11 = local_3f00;
            goto LAB_00107866;
          }
          local_3f18 = 9;
          break;
        case 9:
          if (((*pcVar11 != ':') || (pcVar11[1] != ':')) || (pcVar11[2] != '=')) {
            pcVar11 = local_3f08->name;
            pcVar26 = "Missing \"->\" following: \"%s(%s)\".";
            pcVar23 = local_3f00;
            goto LAB_001075eb;
          }
          goto LAB_00106943;
        case 10:
          if ((*(byte *)((long)*ppuVar10 + (long)*pcVar11 * 2 + 1) & 4) == 0) {
            pcVar23 = *(char **)auStack_3ef0[(long)(int)local_3ef8 + -1];
            pcVar26 = "\"%s\" is not a valid alias for the RHS symbol \"%s\"\n";
            goto LAB_001075eb;
          }
          auStack_1fb8[(int)local_3ef8] = pcVar11;
          local_3f18 = 0xb;
          break;
        case 0xb:
          if (*pcVar11 != ')') goto LAB_001074b1;
LAB_00106943:
          local_3f18 = 6;
          break;
        case 0xc:
          if ((*(byte *)((long)*ppuVar10 + (long)*pcVar11 * 2 + 1) & 1) == 0) {
            Parse_cold_6();
          }
          else if (local_70 == (rule *)0x0) {
            ErrorMsg(local_3f38,local_3f30,"There is no prior rule to assign precedence \"[%s]\".",
                     pcVar11);
            local_3f2c = local_3f2c + 1;
          }
          else if (local_70->precsym == (symbol *)0x0) {
            psVar13 = Symbol_new(pcVar11);
            local_70->precsym = psVar13;
          }
          else {
            Parse_cold_5();
          }
          local_3f18 = 0xd;
          psVar13 = local_3f10;
          break;
        case 0xd:
          if (*pcVar11 != ']') {
            Parse_cold_4();
          }
          goto LAB_0010704a;
        case 0xe:
        case 0xf:
          if (*pcVar11 == '.') {
            local_3f18 = 1;
          }
          if (*pcVar11 != '%') break;
          goto LAB_00106cd1;
        case 0x10:
          if ((*(byte *)((long)*ppuVar10 + (long)*pcVar11 * 2 + 1) & 4) == 0) {
            pcVar11 = "Symbol name missing after %%destructor keyword";
LAB_001075a1:
            ErrorMsg(local_3f38,local_3f30,pcVar11);
            goto LAB_001075a8;
          }
          psVar13 = Symbol_new(pcVar11);
          local_60 = &psVar13->destructor;
          local_50 = &psVar13->destLineno;
          local_58 = 1;
          local_3f18 = 3;
          psVar13 = local_3f10;
          break;
        case 0x11:
          if ((*(byte *)((long)*ppuVar10 + (long)*pcVar11 * 2 + 1) & 4) == 0) {
            pcVar11 = "Symbol name missing after %%type keyword";
            goto LAB_001075a1;
          }
          psVar13 = Symbol_find(pcVar11);
          if (psVar13 == (symbol *)0x0) {
            psVar13 = Symbol_new(pcVar11);
          }
          else if (psVar13->datatype != (char *)0x0) {
            ErrorMsg(local_3f38,local_3f30,"Symbol %%type \"%s\" already defined",pcVar11);
            local_3f2c = local_3f2c + 1;
            local_3f18 = 0xf;
            psVar13 = local_3f10;
            break;
          }
          local_60 = &psVar13->datatype;
          local_58 = 0;
          local_3f18 = 3;
          psVar13 = local_3f10;
          break;
        case 0x12:
          if ((long)*pcVar11 == 0x2e) goto LAB_0010704a;
          if ((*(byte *)((long)*ppuVar10 + (long)*pcVar11 * 2 + 1) & 1) == 0) {
            pcVar23 = "%%fallback argument \"%s\" should be a token";
            goto LAB_00107803;
          }
          psVar13 = Symbol_new(pcVar11);
          if (local_3f10 != (symbol *)0x0) {
            if (psVar13->fallback != (symbol *)0x0) {
              pcVar23 = "More than one fallback assigned to token %s";
              goto LAB_00107803;
            }
            psVar13->fallback = local_3f10;
            local_3f20->has_fallback = 1;
            psVar13 = local_3f10;
          }
          break;
        case 0x13:
          lVar8 = strtol(pcVar11,local_3f78,10);
          local_3f20->nexpected = (int)lVar8;
          if ((local_3f78[0] == pcVar11) || (*local_3f78[0] != '\0')) {
            pcVar11 = "Integer expected after %%expect keyword";
          }
          else {
            if (-1 < (int)lVar8) goto LAB_0010704a;
            pcVar11 = "Integer can\'t be negative after %%expect keyword";
          }
          ErrorMsg(local_3f38,local_3f30,pcVar11);
          local_3f2c = local_3f2c + 1;
          goto LAB_0010704a;
        case 0x14:
          if ((long)*pcVar11 != 0x2e) {
            if ((*(byte *)((long)*ppuVar10 + (long)*pcVar11 * 2 + 1) & 1) == 0) {
              pcVar23 = "%%wildcard argument \"%s\" should be a token";
            }
            else {
              psVar13 = Symbol_new(pcVar11);
              if (local_3f20->wildcard == (symbol *)0x0) {
                local_3f20->wildcard = psVar13;
                psVar13 = local_3f10;
                break;
              }
              pcVar23 = "Extra wildcard to token: %s";
            }
            goto LAB_00107803;
          }
LAB_0010704a:
          local_3f18 = 1;
          psVar13 = local_3f10;
        }
        goto switchD_001067dd_default;
      }
      ErrorMsg(local_3f38,0,"Can\'t read in all %d bytes of this file.",uVar6 & 0xffffffff);
      free(__ptr);
    }
    gp->errorcnt = gp->errorcnt + 1;
  }
  return;
LAB_00107330:
  sprintf((char *)local_3f78,"#line %d ",(ulong)local_3f30);
  sVar7 = strlen((char *)local_3f78);
  sVar30 = strlen(local_3f38);
  iVar24 = iVar32 + iVar24 + (int)sVar7 + (int)sVar30;
  sVar7 = (size_t)(int)sVar7;
LAB_00107374:
  pcVar23 = (char *)realloc(*local_60,(long)iVar24);
  *local_60 = pcVar23;
  pcVar23 = *local_60 + iVar4;
  if (bVar37) {
    if ((iVar4 != 0) && (pcVar23[-1] != '\n')) {
      *pcVar23 = '\n';
      pcVar23 = pcVar23 + 1;
    }
    memcpy(pcVar23,local_3f78,sVar7);
    pcVar26 = pcVar23 + sVar7;
    pcVar23[sVar7] = '\"';
    pcVar23 = local_3f38;
    do {
      if (*pcVar23 == '\\') {
        pcVar26[1] = '\\';
        pcVar26 = pcVar26 + 2;
      }
      else {
        if (*pcVar23 == '\0') goto LAB_0010740f;
        pcVar26 = pcVar26 + 1;
      }
      *pcVar26 = *pcVar23;
      pcVar23 = pcVar23 + 1;
    } while( true );
  }
LAB_0010741c:
  if ((local_50 != (int *)0x0) && (*local_50 == 0)) {
    *local_50 = local_3f30;
  }
  memcpy(pcVar23,pcVar11,(long)iVar5);
  pcVar23[iVar5] = '\0';
  local_3f18 = 1;
  psVar13 = local_3f10;
switchD_001067dd_default:
  local_3f10 = psVar13;
  *pcVar28 = cVar21;
  goto LAB_001064db;
LAB_0010740f:
  pcVar26[1] = '\"';
  pcVar26[2] = '\n';
  pcVar23 = pcVar26 + 3;
  goto LAB_0010741c;
}

Assistant:

void Parse(struct lemon *gp)
{
  struct pstate ps;
  FILE *fp;
  char *filebuf;
  int filesize;
  int lineno;
  int c;
  char *cp, *nextcp;
  int startline = 0;

  memset(&ps, '\0', sizeof(ps));
  ps.gp = gp;
  ps.filename = gp->filename;
  ps.errorcnt = 0;
  ps.state = INITIALIZE;

  /* Begin by reading the input file */
  fp = fopen(ps.filename,"rb");
  if( fp==0 ){
    ErrorMsg(ps.filename,0,"Can't open this file for reading.");
    gp->errorcnt++;
    return;
  }
  fseek(fp,0,2);
  filesize = ftell(fp);
  rewind(fp);
  filebuf = (char *)malloc( filesize+1 );
  if( filebuf==0 ){
    ErrorMsg(ps.filename,0,"Can't allocate %d of memory to hold this file.",
      filesize+1);
    gp->errorcnt++;
    return;
  }
  if( fread(filebuf,1,filesize,fp)!=filesize ){
    ErrorMsg(ps.filename,0,"Can't read in all %d bytes of this file.",
      filesize);
    free(filebuf);
    gp->errorcnt++;
    return;
  }
  fclose(fp);
  filebuf[filesize] = 0;

  /* Make an initial pass through the file to handle %ifdef and %ifndef */
  preprocess_input(filebuf);

  /* Now scan the text of the input file */
  lineno = 1;
  for(cp=filebuf; (c= *cp)!=0; ){
    if( c=='\n' ) lineno++;              /* Keep track of the line number */
    if( isspace(c) ){ cp++; continue; }  /* Skip all white space */
    if( c=='/' && cp[1]=='/' ){          /* Skip C++ style comments */
      cp+=2;
      while( (c= *cp)!=0 && c!='\n' ) cp++;
      continue;
    }
    if( c=='/' && cp[1]=='*' ){          /* Skip C style comments */
      cp+=2;
      while( (c= *cp)!=0 && (c!='/' || cp[-1]!='*') ){
        if( c=='\n' ) lineno++;
        cp++;
      }
      if( c ) cp++;
      continue;
    }
    ps.tokenstart = cp;                /* Mark the beginning of the token */
    ps.tokenlineno = lineno;           /* Linenumber on which token begins */
    if( c=='\"' ){                     /* String literals */
      cp++;
      while( (c= *cp)!=0 && c!='\"' ){
        if( c=='\n' ) lineno++;
        cp++;
      }
      if( c==0 ){
        ErrorMsg(ps.filename,startline,
"String starting on this line is not terminated before the end of the file.");
        ps.errorcnt++;
        nextcp = cp;
      }else{
        nextcp = cp+1;
      }
    }else if( c=='{' ){               /* A block of C code */
      int level;
      cp++;
      for(level=1; (c= *cp)!=0 && (level>1 || c!='}'); cp++){
        if( c=='\n' ) lineno++;
        else if( c=='{' ) level++;
        else if( c=='}' ) level--;
        else if( c=='/' && cp[1]=='*' ){  /* Skip comments */
          int prevc;
          cp = &cp[2];
          prevc = 0;
          while( (c= *cp)!=0 && (c!='/' || prevc!='*') ){
            if( c=='\n' ) lineno++;
            prevc = c;
            cp++;
	  }
	}else if( c=='/' && cp[1]=='/' ){  /* Skip C++ style comments too */
          cp = &cp[2];
          while( (c= *cp)!=0 && c!='\n' ) cp++;
          if( c ) lineno++;
	}else if( c=='\'' || c=='\"' ){    /* String a character literals */
          int startchar, prevc;
          startchar = c;
          prevc = 0;
          for(cp++; (c= *cp)!=0 && (c!=startchar || prevc=='\\'); cp++){
            if( c=='\n' ) lineno++;
            if( prevc=='\\' ) prevc = 0;
            else              prevc = c;
	  }
	}
      }
      if( c==0 ){
        ErrorMsg(ps.filename,ps.tokenlineno,
"C code starting on this line is not terminated before the end of the file.");
        ps.errorcnt++;
        nextcp = cp;
      }else{
        nextcp = cp+1;
      }
    }else if( isalnum(c) ){          /* Identifiers */
      while( (c= *cp)!=0 && (isalnum(c) || c=='_') ) cp++;
      nextcp = cp;
    }else if( c==':' && cp[1]==':' && cp[2]=='=' ){ /* The operator "::=" */
      cp += 3;
      nextcp = cp;
    }else if( (c=='/' || c=='|') && isalpha(cp[1]) ){
      cp += 2;
      while( (c = *cp)!=0 && (isalnum(c) || c=='_') ) cp++;
      nextcp = cp;
    }else{                          /* All other (one character) operators */
      cp++;
      nextcp = cp;
    }
    c = *cp;
    *cp = 0;                        /* Null terminate the token */
    parseonetoken(&ps);             /* Parse the token */
    *cp = c;                        /* Restore the buffer */
    cp = nextcp;
  }
  free(filebuf);                    /* Release the buffer after parsing */
  gp->rule = ps.firstrule;
  gp->errorcnt = ps.errorcnt;
}